

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilCex.c
# Opt level: O1

void Abc_CexPrint(Abc_Cex_t *p)

{
  int iVar1;
  char *__s;
  int iVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar5;
  
  if (p == (Abc_Cex_t *)0x0) {
    __s = "The counter example is NULL.";
  }
  else {
    if (p != (Abc_Cex_t *)0x1) {
      Abc_CexPrintStats(p);
      uVar5 = 0;
      printf("State    : ");
      if (0 < p->nRegs) {
        uVar5 = 0;
        do {
          printf("%d",(ulong)(((uint)(&p[1].iPo)[uVar5 >> 5] >> ((uint)uVar5 & 0x1f) & 1) != 0));
          uVar4 = (uint)uVar5 + 1;
          uVar5 = (ulong)uVar4;
        } while ((int)uVar4 < p->nRegs);
      }
      iVar1 = (int)uVar5;
      putchar(10);
      if (-1 < p->iFrame) {
        uVar3 = 0;
        do {
          iVar2 = (int)uVar3;
          printf("Frame %3d : ",uVar3);
          if (0 < p->nPis) {
            iVar1 = 0;
            do {
              uVar4 = (int)uVar5 + iVar1;
              printf("%d",(ulong)(((uint)(&p[1].iPo)[(int)uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0));
              iVar1 = iVar1 + 1;
            } while (iVar1 < p->nPis);
            uVar5 = (ulong)(uint)((int)uVar5 + iVar1);
          }
          iVar1 = (int)uVar5;
          putchar(10);
          uVar3 = (ulong)(iVar2 + 1);
        } while (iVar2 < p->iFrame);
      }
      if (iVar1 == p->nBits) {
        return;
      }
      __assert_fail("k == p->nBits",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/util/utilCex.c"
                    ,0x150,"void Abc_CexPrint(Abc_Cex_t *)");
    }
    __s = "The counter example is present but not available (pointer has value \"1\").";
  }
  puts(__s);
  return;
}

Assistant:

void Abc_CexPrint( Abc_Cex_t * p )
{
    int i, f, k;
    if ( p == NULL )
    {
        printf( "The counter example is NULL.\n" );
        return;
    }
    if ( p == (Abc_Cex_t *)(ABC_PTRINT_T)1 )
    {
        printf( "The counter example is present but not available (pointer has value \"1\").\n" );
        return;
    }
    Abc_CexPrintStats( p );
    printf( "State    : " );
    for ( k = 0; k < p->nRegs; k++ )
        printf( "%d", Abc_InfoHasBit(p->pData, k) );
    printf( "\n" );
    for ( f = 0; f <= p->iFrame; f++ )
    {
        printf( "Frame %3d : ", f );
        for ( i = 0; i < p->nPis; i++ )
            printf( "%d", Abc_InfoHasBit(p->pData, k++) );
        printf( "\n" );
    }
    assert( k == p->nBits );
}